

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# difference_iterator.hpp
# Opt level: O2

difference_iterator<std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::less<void>_>
* __thiscall
burst::
make_difference_iterator<std::__cxx11::list<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,void>
          (difference_iterator<std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::less<void>_>
           *__return_storage_ptr__,burst *this,list<int,_std::allocator<int>_> *minuend,
          vector<int,_std::allocator<int>_> *subtrahend)

{
  difference_iterator<std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::less<void>_>
  ::difference_iterator
            (__return_storage_ptr__,*(undefined8 *)this,this,
             (minuend->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
             super__List_node_base._M_next,
             (minuend->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
             super__List_node_base._M_prev);
  return __return_storage_ptr__;
}

Assistant:

auto make_difference_iterator (ForwardRange1 && minuend, ForwardRange2 && subtrahend)
    {
        using std::begin;
        using std::end;
        return
            make_difference_iterator
            (
                begin(std::forward<ForwardRange1>(minuend)),
                end(std::forward<ForwardRange1>(minuend)),
                begin(std::forward<ForwardRange2>(subtrahend)),
                end(std::forward<ForwardRange2>(subtrahend))
            );
    }